

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value * __thiscall toml::Value::operator=(Value *this,Value *v)

{
  rep *prVar1;
  void *pvVar2;
  string *psVar3;
  Value *in_RSI;
  Value *in_RDI;
  vector<toml::Value,_std::allocator<toml::Value>_> *unaff_retaddr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *in_stack_ffffffffffffffa8;
  vector<toml::Value,_std::allocator<toml::Value>_> *in_stack_fffffffffffffff8;
  
  if (in_RDI != in_RSI) {
    ~Value(in_RDI);
    in_RDI->type_ = in_RSI->type_;
    switch(in_RSI->type_) {
    case NULL_TYPE:
      in_RDI->field_1 = in_RSI->field_1;
      break;
    case BOOL_TYPE:
      (in_RDI->field_1).bool_ = (bool)((in_RSI->field_1).bool_ & 1);
      break;
    case INT_TYPE:
      in_RDI->field_1 = in_RSI->field_1;
      break;
    case DOUBLE_TYPE:
      in_RDI->field_1 = in_RSI->field_1;
      break;
    case STRING_TYPE:
      psVar3 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)psVar3,(string *)(in_RSI->field_1).string_);
      (in_RDI->field_1).string_ = psVar3;
      break;
    case TIME_TYPE:
      prVar1 = (rep *)operator_new(8);
      *prVar1 = (((in_RSI->field_1).time_)->__d).__r;
      (in_RDI->field_1).null_ = prVar1;
      break;
    case ARRAY_TYPE:
      pvVar2 = operator_new(0x18);
      std::vector<toml::Value,_std::allocator<toml::Value>_>::vector
                (unaff_retaddr,in_stack_fffffffffffffff8);
      (in_RDI->field_1).null_ = pvVar2;
      break;
    case TABLE_TYPE:
      psVar3 = (string *)operator_new(0x30);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
             *)psVar3,in_stack_ffffffffffffffa8);
      (in_RDI->field_1).string_ = psVar3;
      break;
    default:
      in_RDI->type_ = NULL_TYPE;
      (in_RDI->field_1).null_ = (void *)0x0;
    }
  }
  return in_RDI;
}

Assistant:

inline Value& Value::operator=(const Value& v)
{
    if (this == &v)
        return *this;

    this->~Value();

    type_ = v.type_;
    switch (v.type_) {
    case NULL_TYPE: null_ = v.null_; break;
    case BOOL_TYPE: bool_ = v.bool_; break;
    case INT_TYPE: int_ = v.int_; break;
    case DOUBLE_TYPE: double_ = v.double_; break;
    case STRING_TYPE: string_ = new std::string(*v.string_); break;
    case TIME_TYPE: time_ = new Time(*v.time_); break;
    case ARRAY_TYPE: array_ = new Array(*v.array_); break;
    case TABLE_TYPE: table_ = new Table(*v.table_); break;
    default:
        assert(false);
        type_ = NULL_TYPE;
        null_ = nullptr;
    }

    return *this;
}